

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void FromWabtValues(Store *store,wasm_val_vec_t *values,ValueTypes *types,Values *wabt_values)

{
  u64 *puVar1;
  wasm_val_t *pwVar2;
  size_t sVar3;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  wasm_val_t wVar7;
  TypedValue local_48;
  
  sVar3 = (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (sVar3 != (long)(wabt_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(wabt_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 4) {
    __assert_fail("types.size() == wabt_values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1f2,
                  "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
                 );
  }
  if (sVar3 == values->size) {
    pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar4) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        local_48.type = pTVar4[uVar6];
        puVar1 = (u64 *)((long)&((wabt_values->
                                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5);
        local_48.value.field_0.i64_ = *puVar1;
        local_48.value.field_0._8_8_ = puVar1[1];
        wVar7 = FromWabtValue(store,&local_48);
        pwVar2 = values->data;
        (&pwVar2->kind)[lVar5] = wVar7.kind;
        ((anon_union_8_5_30786955_for_of *)((long)&pwVar2->of + lVar5))->i64 = (int64_t)wVar7.of;
        uVar6 = uVar6 + 1;
        pTVar4 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 3))
      ;
    }
    return;
  }
  __assert_fail("types.size() == values->size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,499,
                "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
               );
}

Assistant:

static void FromWabtValues(Store& store,
                           wasm_val_vec_t* values,
                           const ValueTypes& types,
                           const Values& wabt_values) {
  assert(types.size() == wabt_values.size());
  assert(types.size() == values->size);
  for (size_t i = 0; i < types.size(); ++i) {
    values->data[i] =
        FromWabtValue(store, TypedValue{types[i], wabt_values[i]});
  }
}